

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

void calcBias<Blob<768>,Blob<128>>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  int iBit;
  uint32_t bit;
  int iOut;
  uint32_t bit_00;
  Blob<128> B;
  Blob<128> A;
  Blob<768> K;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_b8 = ZEXT416(0) << 0x40;
  if (0 < reps) {
    uVar4 = 0;
    local_a8 = local_b8;
    do {
      if ((verbose) && ((int)(uVar4 % ((ulong)(uint)reps / 10)) == 0)) {
        putchar(0x2e);
      }
      Rand::rand_p(r,&local_98,0x60);
      bit = 0;
      (*hash)(&local_98,0x60,0,local_a8);
      piVar5 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(&local_98,0x60,bit);
        (*hash)(&local_98,0x60,0,local_b8);
        flipbit(&local_98,0x60,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(local_a8,0x10,bit_00);
          uVar2 = getbit(local_b8,0x10,bit_00);
          bit_00 = bit_00 + 1;
          *piVar5 = *piVar5 + (uVar2 ^ uVar1);
          piVar5 = piVar5 + 1;
        } while (bit_00 != 0x80);
        bit = bit + 1;
      } while (bit != 0x300);
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != reps);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}